

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
fmt::v11::detail::format_handler<char>::on_format_specs
          (format_handler<char> *this,int id,char *begin,char *end)

{
  buffered_context<char> *ctx;
  bool bVar1;
  char *pcVar2;
  arg_id_kind aVar3;
  basic_format_arg<fmt::v11::context> arg;
  dynamic_format_specs<char> specs;
  basic_format_arg<fmt::v11::context> bStack_98;
  dynamic_format_specs<char> local_78;
  arg_formatter<char> local_40;
  
  ctx = &this->ctx;
  get_arg<fmt::v11::context,int>(&bStack_98,(detail *)ctx,(context *)(ulong)(uint)id,(int)end);
  bVar1 = basic_format_arg<fmt::v11::context>::format_custom(&bStack_98,begin,&this->parse_ctx,ctx);
  if (bVar1) {
    pcVar2 = (this->parse_ctx).fmt_.data_;
  }
  else {
    local_78.width_ref.name.size_ = 0;
    local_78.precision_ref.name.size_ = 0;
    local_78.super_format_specs.super_basic_specs.data_ = 0x8000;
    local_78.super_format_specs.super_basic_specs.fill_data_[0] = ' ';
    local_78.super_format_specs.super_basic_specs.fill_data_[1] = '\0';
    local_78.super_format_specs.super_basic_specs.fill_data_[2] = '\0';
    local_78.super_format_specs.super_basic_specs.fill_data_[3] = '\0';
    local_78.super_format_specs.width = 0;
    local_78.super_format_specs.precision = -1;
    local_78.width_ref.name.data_ = (char *)0x0;
    local_78.precision_ref.name.data_ = (char *)0x0;
    pcVar2 = parse_format_specs<char>(begin,end,&local_78,&this->parse_ctx,bStack_98.type_);
    if ((local_78.super_format_specs.super_basic_specs.data_ & 0x3c0) != 0) {
      aVar3 = local_78.super_format_specs.super_basic_specs.data_ >> 6 & (name|index);
      if (aVar3 != none) {
        local_78.super_format_specs.width =
             get_dynamic_spec<fmt::v11::context>(aVar3,&local_78.width_ref,ctx);
      }
      aVar3 = local_78.super_format_specs.super_basic_specs.data_ >> 8 & (name|index);
      if (aVar3 != none) {
        local_78.super_format_specs.precision =
             get_dynamic_spec<fmt::v11::context>(aVar3,&local_78.precision_ref,ctx);
      }
    }
    local_40.out.container = (this->ctx).out_.container;
    local_40.locale.locale_ = (this->ctx).loc_.locale_;
    local_40.specs = &local_78.super_format_specs;
    basic_format_arg<fmt::v11::context>::visit<fmt::v11::detail::arg_formatter<char>>
              (&bStack_98,&local_40);
  }
  return pcVar2;
}

Assistant:

auto on_format_specs(int id, const Char* begin, const Char* end)
      -> const Char* {
    auto arg = get_arg(ctx, id);
    // Not using a visitor for custom types gives better codegen.
    if (arg.format_custom(begin, parse_ctx, ctx)) return parse_ctx.begin();

    auto specs = dynamic_format_specs<Char>();
    begin = parse_format_specs(begin, end, specs, parse_ctx, arg.type());
    if (specs.dynamic()) {
      handle_dynamic_spec(specs.dynamic_width(), specs.width, specs.width_ref,
                          ctx);
      handle_dynamic_spec(specs.dynamic_precision(), specs.precision,
                          specs.precision_ref, ctx);
    }

    arg.visit(arg_formatter<Char>{ctx.out(), specs, ctx.locale()});
    return begin;
  }